

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  float size;
  ImFont *this;
  undefined4 uVar1;
  undefined4 uVar2;
  char *text_end;
  ImDrawList *draw_list_00;
  uint uVar3;
  ImU32 col;
  ImFontGlyph *pIVar4;
  int iVar5;
  ImGuiContext *g;
  ImGuiContext *pIVar6;
  char *text_display_end;
  bool bVar7;
  uint uVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  float fVar12;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float local_c0;
  char *text_end_ellipsis;
  float local_ac;
  ImVec2 local_a8;
  float local_a0;
  uint local_9c;
  ImVec2 local_98;
  undefined8 uStack_90;
  uint dummy;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  ImVec2 *local_70;
  ImVec2 *local_68;
  char *local_60;
  undefined1 local_58 [16];
  ImGuiContext *local_48;
  ImDrawList *local_40;
  ImVec2 local_38;
  undefined8 extraout_XMM0_Qb;
  
  pIVar6 = GImGui;
  local_58._4_4_ = in_XMM1_Db;
  local_58._0_4_ = ellipsis_max_x;
  local_58._8_4_ = in_XMM1_Dc;
  local_58._12_4_ = in_XMM1_Dd;
  if ((text_end_full == (char *)0x0) && (text_end_full = text, text != (char *)0xffffffffffffffff))
  {
    do {
      if (*text_end_full == '#') {
        if (text_end_full[1] == '#') goto LAB_001922ee;
      }
      else if (*text_end_full == '\0') goto LAB_001922ee;
      text_end_full = text_end_full + 1;
    } while (text_end_full != (char *)0xffffffffffffffff);
    text_end_full = (char *)0xffffffffffffffff;
  }
LAB_001922ee:
  local_ac = clip_max_x;
  if (text_size_if_known == (ImVec2 *)0x0) {
    if (text_end_full == text) {
      local_a8 = (ImVec2)((ulong)(uint)GImGui->FontSize << 0x20);
    }
    else {
      auVar10._0_8_ =
           ImFont::CalcTextSizeA
                     (GImGui->Font,GImGui->FontSize,3.4028235e+38,0.0,text,text_end_full,
                      (char **)0x0);
      auVar10._8_8_ = extraout_XMM0_Qb;
      auVar11._4_12_ = auVar10._4_12_;
      auVar11._0_4_ = (float)(int)(auVar10._0_4_ + 0.95);
      local_a8 = auVar11._0_8_;
    }
  }
  else {
    local_a8 = *text_size_if_known;
  }
  if (local_a8.x <= pos_max->x - pos_min->x) {
    fStack_84 = pos_max->y;
    dummy = (uint)local_ac;
    text_end_ellipsis = (char *)0x0;
    RenderTextClippedEx(draw_list,pos_min,(ImVec2 *)&dummy,text,text_end_full,&local_a8,
                        (ImVec2 *)&text_end_ellipsis,(ImRect *)0x0);
  }
  else {
    this = draw_list->_Data->Font;
    size = draw_list->_Data->FontSize;
    text_end_ellipsis = (char *)0x0;
    uVar8._0_2_ = this->EllipsisChar;
    uVar8._2_1_ = this->DirtyLookupTables;
    uVar8._3_1_ = this->field_0x5f;
    uVar3 = 0x2e;
    if ((undefined2)uVar8 != -1) {
      uVar3 = uVar8;
    }
    local_9c = uVar3 & 0xffff;
    local_70 = pos_max;
    local_68 = pos_min;
    pIVar4 = ImFont::FindGlyph(this,(ImWchar)uVar3);
    local_a0 = pIVar4->X1;
    bVar7 = (undefined2)uVar8 == -1;
    iVar5 = bVar7 + 1 + (uint)bVar7;
    local_c0 = local_a0;
    if (bVar7) {
      fVar12 = draw_list->_Data->FontSize / this->FontSize;
      local_c0 = (local_a0 - pIVar4->X0) + fVar12;
      local_a0 = (float)iVar5 * local_c0 - fVar12;
    }
    uVar8 = -(uint)((float)local_58._0_4_ <= local_70->x);
    fVar12 = ((float)(~uVar8 & local_58._0_4_ | (uint)local_70->x & uVar8) - local_a0) - local_68->x
    ;
    if (fVar12 <= 1.0) {
      fVar12 = 1.0;
    }
    local_60 = text;
    local_40 = draw_list;
    local_98 = ImFont::CalcTextSizeA(this,size,fVar12,0.0,text,text_end_full,&text_end_ellipsis);
    uStack_90 = extraout_XMM0_Qb_00;
    local_48 = pIVar6;
    text_end = text_end_ellipsis;
    pos_min = local_68;
    draw_list_00 = local_40;
    if (text_end_ellipsis < text_end_full && text_end_ellipsis == text) {
      _dummy = (ImVec2)((ulong)_dummy & 0xffffffff00000000);
      uVar8 = ImTextCharFromUtf8(&dummy,text,text_end_full);
      text_end_ellipsis = text + uVar8;
      local_98 = ImFont::CalcTextSizeA
                           (this,size,3.4028235e+38,0.0,text,text_end_ellipsis,(char **)0x0);
      uStack_90 = extraout_XMM0_Qb_01;
      text_end = text_end_ellipsis;
      pos_min = local_68;
      draw_list_00 = local_40;
    }
    while ((local_68 = pos_min, local_40 = draw_list_00, text < text_end &&
           ((text_end[-1] == ' ' || (text_end[-1] == '\t'))))) {
      text_end_ellipsis = text_end + -1;
      IVar9 = ImFont::CalcTextSizeA
                        (this,size,3.4028235e+38,0.0,text_end_ellipsis,text_end,(char **)0x0);
      local_98.x = local_98.x - IVar9.x;
      text_end = text_end_ellipsis;
      pos_min = local_68;
      draw_list_00 = local_40;
    }
    fStack_84 = local_70->y;
    dummy = (uint)local_ac;
    local_38.x = 0.0;
    local_38.y = 0.0;
    text_end_ellipsis = text_end;
    RenderTextClippedEx(draw_list_00,pos_min,(ImVec2 *)&dummy,text,text_end,&local_a8,&local_38,
                        (ImRect *)0x0);
    uVar8 = local_9c;
    fVar12 = local_98.x + pos_min->x;
    text = local_60;
    pIVar6 = local_48;
    if (local_a0 + fVar12 <= (float)local_58._0_4_) {
      do {
        local_98.x = fVar12;
        local_58 = ZEXT416((uint)pos_min->y);
        dummy = (uint)(GImGui->Style).Colors[0].x;
        fStack_84 = (GImGui->Style).Colors[0].y;
        uVar1 = (GImGui->Style).Colors[0].z;
        uVar2 = (GImGui->Style).Colors[0].w;
        fStack_7c = (GImGui->Style).Alpha * (float)uVar2;
        fStack_80 = (float)uVar1;
        col = ColorConvertFloat4ToU32((ImVec4 *)&dummy);
        IVar9.y = (float)local_58._0_4_;
        IVar9.x = local_98.x;
        ImFont::RenderChar(this,draw_list_00,size,IVar9,col,(ImWchar)uVar8);
        fVar12 = local_98.x + local_c0;
        iVar5 = iVar5 + -1;
        text = local_60;
        pIVar6 = local_48;
      } while (iVar5 != 0);
    }
  }
  if (pIVar6->LogEnabled == true) {
    LogRenderedText(pos_min,text,text_end_full);
  }
  return;
}

Assistant:

void ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    //draw_list->AddLine(ImVec2(pos_max.x, pos_min.y - 4), ImVec2(pos_max.x, pos_max.y + 4), IM_COL32(0, 0, 255, 255));
    //draw_list->AddLine(ImVec2(ellipsis_max_x, pos_min.y-2), ImVec2(ellipsis_max_x, pos_max.y+2), IM_COL32(0, 255, 0, 255));
    //draw_list->AddLine(ImVec2(clip_max_x, pos_min.y), ImVec2(clip_max_x, pos_max.y), IM_COL32(255, 0, 0, 255));
    // FIXME: We could technically remove (last_glyph->AdvanceX - last_glyph->X1) from text_size.x here and save a few pixels.
    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const char* text_end_ellipsis = NULL;

        ImWchar ellipsis_char = font->EllipsisChar;
        int ellipsis_char_count = 1;
        if (ellipsis_char == (ImWchar)-1)
        {
            ellipsis_char = (ImWchar)'.';
            ellipsis_char_count = 3;
        }
        const ImFontGlyph* glyph = font->FindGlyph(ellipsis_char);

        float ellipsis_glyph_width = glyph->X1;                 // Width of the glyph with no padding on either side
        float ellipsis_total_width = ellipsis_glyph_width;      // Full width of entire ellipsis

        if (ellipsis_char_count > 1)
        {
            // Full ellipsis size without free spacing after it.
            const float spacing_between_dots = 1.0f * (draw_list->_Data->FontSize / font->FontSize);
            ellipsis_glyph_width = glyph->X1 - glyph->X0 + spacing_between_dots;
            ellipsis_total_width = ellipsis_glyph_width * (float)ellipsis_char_count - spacing_between_dots;
        }

        // We can now claim the space between pos_max.x and ellipsis_max.x
        const float text_avail_width = ImMax((ImMax(pos_max.x, ellipsis_max_x) - ellipsis_total_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_avail_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis (FIXME: Supporting non-ascii blanks would be nice, for this we need a function to backtrack in UTF-8 text)
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }

        // Render text, render ellipsis
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));
        float ellipsis_x = pos_min.x + text_size_clipped_x;
        if (ellipsis_x + ellipsis_total_width <= ellipsis_max_x)
            for (int i = 0; i < ellipsis_char_count; i++)
            {
                font->RenderChar(draw_list, font_size, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_char);
                ellipsis_x += ellipsis_glyph_width;
            }
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}